

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O1

MaybeResult<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::block<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
          (MaybeResult<wasm::WATParser::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx,
          bool folded)

{
  ParseInput *this;
  undefined1 *puVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  Index pos;
  undefined7 in_register_00000011;
  Result<wasm::WATParser::Ok> *__x;
  _Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
  *__x_00;
  _Alloc_hider _Var6;
  char cVar7;
  int iVar9;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  Signature SVar10;
  undefined1 local_198 [8];
  optional<wasm::Name> label;
  size_type local_170 [2];
  string local_160;
  string local_140;
  uintptr_t local_120;
  size_type __dnew;
  vector<wasm::Name,_std::allocator<wasm::Name>_> local_110;
  string local_f8;
  undefined1 local_d8 [8];
  Result<wasm::WATParser::Ok> insts;
  Result<wasm::HeapType> type;
  Result<wasm::HeapType> _val_2;
  undefined1 local_58 [8];
  Result<wasm::HeapType> type_1;
  undefined4 uVar8;
  
  this = &ctx->in;
  ParseInput::getPos(this);
  iVar9 = (int)CONCAT71(in_register_00000011,folded);
  if (iVar9 == 0) {
    expected_00._M_str = "block";
    expected_00._M_len = 5;
    bVar5 = ParseInput::takeKeyword(this,expected_00);
  }
  else {
    expected._M_str = "block";
    expected._M_len = 5;
    bVar5 = ParseInput::takeSExprStart(this,expected);
  }
  if (bVar5 == false) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
     + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
  super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
  super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
  super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
  super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
  super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._36_4_ = iVar9;
  ParseInput::takeID((optional<wasm::Name> *)local_198,this);
  pos = ParseInput::getPos(this);
  results<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
            ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)local_d8,ctx);
  if (insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._24_1_ == '\x01')
  {
LAB_00a3729d:
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)local_d8);
    (ctx->in).lexer.index = (ulong)pos;
    Lexer::skipSpace(&this->lexer);
    Lexer::lexToken(&this->lexer);
    typeuse<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
              ((Result<wasm::WATParser::(anonymous_namespace)::TypeUse> *)local_d8,ctx);
    Result<wasm::WATParser::(anonymous_namespace)::TypeUse>::Result
              ((Result<wasm::WATParser::(anonymous_namespace)::TypeUse> *)local_58,
               (Result<wasm::WATParser::(anonymous_namespace)::TypeUse> *)local_d8);
    if (type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ == '\x01') {
      puVar1 = (undefined1 *)
               ((long)&_val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 8);
      type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ = puVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20),
                 local_58,(long)type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>
                                .super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                _M_u._M_first._M_storage.id + (long)local_58);
      uVar8 = _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
              super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
              super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
              super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
              super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._36_4_;
      insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._32_8_ =
           (long)&type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 8;
      if ((undefined1 *)
          type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ == puVar1) {
        type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._16_8_ =
             _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._16_8_;
      }
      else {
        insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_index =
             type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_index;
        insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._33_7_ =
             type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._33_7_;
      }
      type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._9_7_ =
           _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._9_7_;
      type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_1_ =
           _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_1_;
      type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first._M_storage.id
           = _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first.
             _M_storage.id;
      type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ = 1;
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::(anonymous_namespace)::TypeUse,_wasm::WATParser::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::(anonymous_namespace)::TypeUse,_wasm::WATParser::Err>
                           *)local_58);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::(anonymous_namespace)::TypeUse,_wasm::WATParser::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::(anonymous_namespace)::TypeUse,_wasm::WATParser::Err>
                           *)local_58);
      __dnew = (size_type)local_d8;
      __x = (Result<wasm::WATParser::Ok> *)&DAT_00000008;
      if (insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._24_1_ ==
          '\0') {
        __x = &insts;
      }
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
                (&local_110,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)__x);
      bVar5 = HeapType::isSignature((HeapType *)&__dnew);
      if (!bVar5) {
        __assert_fail("use.type.isSignature()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wat-parser.cpp"
                      ,0x4c1,
                      "Result<HeapType> wasm::WATParser::(anonymous namespace)::ParseModuleTypesCtx::getBlockTypeFromTypeUse(Index, TypeUse)"
                     );
      }
      SVar10 = HeapType::getSignature((HeapType *)&__dnew);
      if (SVar10.params.id.id == 0) {
        local_58 = (undefined1  [8])__dnew;
        type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ = 0;
        uVar8 = _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._36_4_;
      }
      else {
        local_120 = 0x22;
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        local_f8._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_f8,(ulong)&local_120);
        local_f8.field_2._M_allocated_capacity = local_120;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0x10) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0x11) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0x12) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0x13) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0x14) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0x15) = 'y';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0x16) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0x17) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0x18) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0x19) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0x1a) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0x1b) = 'p';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0x1c) = 'p';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0x1d) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0x1e) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0x1f) = 't';
        *(undefined8 *)local_f8._M_dataplus._M_p = 0x6170206b636f6c62;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 8) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 9) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 10) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0xb) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0xc) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0xd) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0xe) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0xf) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0x20) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p + 0x21) = 'd';
        local_f8._M_string_length = local_120;
        local_f8._M_dataplus._M_p[local_120] = '\0';
        ParseInput::err((Err *)((long)&type.val.
                                       super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                       super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                       .
                                       super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                       .super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                       .super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                               + 0x20),this,pos,&local_f8);
        uVar8 = _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._36_4_;
        local_58 = (undefined1  [8])
                   ((long)&type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 8);
        puVar1 = (undefined1 *)
                 ((long)&_val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 8);
        if ((undefined1 *)
            type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
            super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
            super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
            super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
            super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ == puVar1) {
          type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._16_8_ =
               _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._16_8_;
        }
        else {
          local_58 = (undefined1  [8])
                     type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_;
        }
        type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._9_7_ =
             _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._9_7_;
        type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_1_ =
             _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_1_;
        type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first._M_storage.
        id = _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first.
             _M_storage.id;
        _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first._M_storage.
        id = (_Uninitialized<wasm::HeapType,_true>)(HeapType)0x0;
        _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_1_ = 0;
        type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ = 1;
        type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ = puVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_110.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_110.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_110.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_110.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                      ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                              super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                              super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                              super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                              super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20),
                      (_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err> *)local_58);
      if (_val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ == '\x01')
      {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,
                   type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_,
                   (long)_val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u.
                         _M_first._M_storage.id +
                   type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_);
        insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._32_8_ =
             (long)&type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
          type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._16_8_ =
               local_f8.field_2._8_8_;
        }
        else {
          insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._32_8_ =
               local_f8._M_dataplus._M_p;
        }
        type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_8_ =
             local_f8.field_2._M_allocated_capacity;
        type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first._M_storage.
        id = (_Uninitialized<wasm::HeapType,_true>)
             (_Uninitialized<wasm::HeapType,_true>)local_f8._M_string_length;
        type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ = 1;
        std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                          ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>
                                  .super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                  super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                  super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                  super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                          0x20));
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                          ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>
                                  .super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                  super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                  super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                  super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                          0x20));
        insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._32_8_ = local_58;
        type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ = 0;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)local_58);
    }
    cVar7 = (char)uVar8;
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::(anonymous_namespace)::TypeUse,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::(anonymous_namespace)::TypeUse,_wasm::WATParser::Err>
                       *)local_d8);
  }
  else {
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
                       *)local_58,
                      (_Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
                       *)local_d8);
    if (type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ == '\x02') {
      puVar1 = (undefined1 *)
               ((long)&_val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 8);
      type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ = puVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20),
                 local_58,(long)type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>
                                .super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                _M_u._M_first._M_storage.id + (long)local_58);
      uVar8 = _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
              super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
              super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
              super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
              super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._36_4_;
      insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._32_8_ =
           (long)&type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 8;
      if ((undefined1 *)
          type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ == puVar1) {
        type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._16_8_ =
             _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._16_8_;
      }
      else {
        insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_index =
             type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_index;
        insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._33_7_ =
             type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._33_7_;
      }
      type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._9_7_ =
           _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._9_7_;
      type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_1_ =
           _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_1_;
      type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first._M_storage.id
           = _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first.
             _M_storage.id;
      type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ = 1;
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
                           *)local_58);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
                           *)local_58);
      __x_00 = (_Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
                *)0x0;
      if (insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._24_1_ ==
          '\0') {
        __x_00 = (_Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
                  *)local_d8;
      }
      if (*(long *)((long)&(__x_00->
                           super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                           )._M_u + 8) -
          *(long *)&(__x_00->
                    super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                    )._M_u != 8) goto LAB_00a3729d;
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_58,
                 (vector<wasm::Type,_std::allocator<wasm::Type>_> *)__x_00);
      uVar8 = _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
              super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
              super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
              super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
              super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._36_4_;
      if ((long)type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first.
                _M_storage.id - (long)local_58 != 8) {
        __assert_fail("results.size() == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wat-parser.cpp"
                      ,0x294,
                      "HeapType wasm::WATParser::(anonymous namespace)::TypeParserCtx<wasm::WATParser::(anonymous namespace)::ParseModuleTypesCtx>::getBlockTypeFromResult(const std::vector<Type>) [Ctx = wasm::WATParser::(anonymous namespace)::ParseModuleTypesCtx]"
                     );
      }
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)local_58;
      HeapType::HeapType((HeapType *)
                         ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                 super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                 super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                 super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                 super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20
                         ),(Signature)(auVar4 << 0x40));
      insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_index =
           type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_index;
      insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._33_7_ =
           type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._33_7_;
      type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ = 0;
      if (local_58 != (undefined1  [8])0x0) {
        operator_delete((void *)local_58,
                        type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u.
                        _8_8_ - (long)local_58);
      }
    }
    cVar7 = (char)uVar8;
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)local_d8);
  }
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err> *)local_d8,
                  (_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                  ((long)&insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20))
  ;
  if (insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._24_1_ == '\x01')
  {
    puVar2 = (ulong *)((long)&type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                              super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                              super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                              super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                              super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 8);
    local_58 = (undefined1  [8])puVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,local_d8,
               insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._0_8_ +
               (long)local_d8);
    puVar3 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).
      super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
         = puVar3;
    if (local_58 == (undefined1  [8])puVar2) {
      *puVar3 = type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
       + 0x18) = type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).
        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           = local_58;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
       + 0x10) = type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_8_;
    }
    ((_Uninitialized<wasm::HeapType,_true> *)
    ((long)&(__return_storage_ptr__->val).
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
    + 8))->_M_storage =
         (HeapType)
         type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
         super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
         super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
         super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
         super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
         super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first._M_storage
         .id;
    type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first._M_storage.id =
         (_Uninitialized<wasm::HeapType,_true>)(HeapType)0x0;
    type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_8_ =
         type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
         super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
         super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
         super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
         super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
         super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_8_ &
         0xffffffffffffff00;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
     + 0x20) = '\x02';
    local_58 = (undefined1  [8])puVar2;
    std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)local_d8);
    goto LAB_00a379ce;
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)local_d8);
  instrs<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
            ((Result<wasm::WATParser::Ok> *)local_d8,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_58,
                  (_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_d8);
  if (type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ == '\x01') {
    puVar1 = (undefined1 *)
             ((long)&_val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 8);
    type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ = puVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20),local_58
               ,(long)type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u.
                      _M_first._M_storage.id + (long)local_58);
    puVar3 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).
      super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
         = puVar3;
    if ((undefined1 *)
        type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ == puVar1) {
      *puVar3 = CONCAT71(_val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u.
                         _9_7_,_val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                               super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                               super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                               super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                               super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                               super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>.
                               _M_u._8_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
       + 0x18) = _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._16_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).
        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           = type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                + 0x10) =
           CONCAT71(_val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._9_7_,
                    _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_1_);
    }
    ((_Uninitialized<wasm::HeapType,_true> *)
    ((long)&(__return_storage_ptr__->val).
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
    + 8))->_M_storage =
         (HeapType)
         _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
         super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
         super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
         super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
         super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
         super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first._M_storage
         .id;
    _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first._M_storage.id =
         (_Uninitialized<wasm::HeapType,_true>)(HeapType)0x0;
    _val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_1_ = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
     + 0x20) = '\x02';
    type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ = puVar1;
    std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_58
                     );
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_58
                     );
    if (cVar7 == '\0') {
      expected_01._M_str = "end";
      expected_01._M_len = 3;
      bVar5 = ParseInput::takeKeyword(this,expected_01);
      if (bVar5) {
        ParseInput::takeID((optional<wasm::Name> *)
                           ((long)&type.val.
                                   super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                           0x20),this);
        if ((_val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_1_ != '\x01'
            ) || ((label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\x01' &&
                  (_val_2.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                   super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first.
                   _M_storage.id ==
                   (_Uninitialized<wasm::HeapType,_true>)
                   label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                   _M_len)))) goto LAB_00a37891;
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,"end label does not match block label","");
        ParseInput::err((Err *)local_58,this,&local_140);
        puVar3 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             = puVar3;
        puVar2 = (ulong *)((long)&type_1.val.
                                  super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                  super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                  super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                  super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                  super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 8);
        if (local_58 == (undefined1  [8])puVar2) {
          *puVar3 = type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           + 0x18) = type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._16_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               = local_58;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           + 0x10) = type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_8_;
        }
        ((_Uninitialized<wasm::HeapType,_true> *)
        ((long)&(__return_storage_ptr__->val).
                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
        + 8))->_M_storage =
             (HeapType)
             type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first.
             _M_storage.id;
        type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first._M_storage.
        id = (_Uninitialized<wasm::HeapType,_true>)(HeapType)0x0;
        type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_8_ =
             type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_8_ &
             0xffffffffffffff00;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
         + 0x20) = '\x02';
        _Var6._M_p = local_140._M_dataplus._M_p;
        local_58 = (undefined1  [8])puVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) goto LAB_00a379ba;
      }
      else {
        type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_index = '\x1e';
        type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._33_7_ = 0;
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        local_160._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create
                                ((ulong *)&local_160,
                                 (ulong)((long)&type.val.
                                                super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>
                                                .
                                                super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                                .
                                                super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                                .
                                                super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                                .
                                                super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                        + 0x20));
        local_160.field_2._M_allocated_capacity =
             type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p + 0xe) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p + 0xf) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p + 0x10) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p + 0x11) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p + 0x12) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p + 0x13) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p + 0x14) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p + 0x15) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p + 0x16) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p + 0x17) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p + 0x18) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p + 0x19) = 'b';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p + 0x1a) = 'l';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p + 0x1b) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p + 0x1c) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p + 0x1d) = 'k';
        *(undefined8 *)local_160._M_dataplus._M_p = 0x6465746365707865;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p + 8) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p + 9) = '\'';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p + 10) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p + 0xb) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p + 0xc) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p + 0xd) = '\'';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p + 0xe) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p + 0xf) = 'a';
        local_160._M_string_length =
             type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_;
        local_160._M_dataplus._M_p
        [type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
         super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
         super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
         super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
         super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
         super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_] = '\0';
        ParseInput::err((Err *)local_58,this,&local_160);
        puVar3 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             = puVar3;
        puVar2 = (ulong *)((long)&type_1.val.
                                  super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                  super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                  super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                  super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                  super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 8);
        if (local_58 == (undefined1  [8])puVar2) {
          *puVar3 = type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           + 0x18) = type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._16_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               = local_58;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           + 0x10) = type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_8_;
        }
        ((_Uninitialized<wasm::HeapType,_true> *)
        ((long)&(__return_storage_ptr__->val).
                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
        + 8))->_M_storage =
             (HeapType)
             type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first.
             _M_storage.id;
        type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first._M_storage.
        id = (_Uninitialized<wasm::HeapType,_true>)(HeapType)0x0;
        type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_8_ =
             type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_8_ &
             0xffffffffffffff00;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
         + 0x20) = '\x02';
        local_140.field_2._M_allocated_capacity = local_160.field_2._M_allocated_capacity;
        _Var6._M_p = local_160._M_dataplus._M_p;
        local_58 = (undefined1  [8])puVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
LAB_00a379ba:
          local_58 = (undefined1  [8])
                     ((long)&type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 8);
          type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first.
          _M_storage.id = (_Uninitialized<wasm::HeapType,_true>)(HeapType)0x0;
          operator_delete(_Var6._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else {
      bVar5 = ParseInput::takeRParen(this);
      if (bVar5) {
LAB_00a37891:
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
         + 0x20) = '\0';
      }
      else {
        type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_index = '\x1c';
        type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._33_7_ = 0;
        label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._16_8_ = local_170;
        label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._16_8_ =
             std::__cxx11::string::_M_create
                       ((ulong *)&label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                                  super__Optional_payload_base<wasm::Name>._M_engaged,
                        (ulong)((long)&type.val.
                                       super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                       super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                       .
                                       super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                       .super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                       .super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                               + 0x20));
        local_170[0] = type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_;
        builtin_strncpy((char *)label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                                super__Optional_payload_base<wasm::Name>._16_8_,
                        "expected \')\' at end of block",0x1c);
        *(char *)(label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._16_8_ +
                 type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_) = '\0';
        ParseInput::err((Err *)local_58,this,
                        (string *)
                        &label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._M_engaged);
        puVar3 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             = puVar3;
        puVar2 = (ulong *)((long)&type_1.val.
                                  super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                  super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                  super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                  super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                  super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 8);
        if (local_58 == (undefined1  [8])puVar2) {
          *puVar3 = type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           + 0x18) = type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._16_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               = local_58;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           + 0x10) = type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_8_;
        }
        ((_Uninitialized<wasm::HeapType,_true> *)
        ((long)&(__return_storage_ptr__->val).
                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
        + 8))->_M_storage =
             (HeapType)
             type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first.
             _M_storage.id;
        type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first._M_storage.
        id = (_Uninitialized<wasm::HeapType,_true>)(HeapType)0x0;
        type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_8_ =
             type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_8_ &
             0xffffffffffffff00;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
         + 0x20) = '\x02';
        local_140.field_2._M_allocated_capacity = local_170[0];
        _Var6._M_p = (pointer)label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                              super__Optional_payload_base<wasm::Name>._16_8_;
        local_58 = (undefined1  [8])puVar2;
        if ((size_type *)
            label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Name>._16_8_ != local_170) goto LAB_00a379ba;
      }
    }
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)local_d8);
LAB_00a379ce:
  std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                    ((long)&insts.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                            .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20
                    ));
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::InstrT> block(Ctx& ctx, bool folded) {
  auto pos = ctx.in.getPos();

  if (folded) {
    if (!ctx.in.takeSExprStart("block"sv)) {
      return {};
    }
  } else {
    if (!ctx.in.takeKeyword("block"sv)) {
      return {};
    }
  }

  auto label = ctx.in.takeID();

  auto type = blocktype(ctx);
  CHECK_ERR(type);

  auto insts = instrs(ctx);
  CHECK_ERR(insts);

  if (folded) {
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected ')' at end of block");
    }
  } else {
    if (!ctx.in.takeKeyword("end"sv)) {
      return ctx.in.err("expected 'end' at end of block");
    }
    auto id = ctx.in.takeID();
    if (id && id != label) {
      return ctx.in.err("end label does not match block label");
    }
  }

  return ctx.makeBlock(pos, label, *type, std::move(*insts));
}